

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_color.h
# Opt level: O3

void std::
     __unguarded_linear_insert<crnlib::unique_color_projection*,__gnu_cxx::__ops::_Val_comp_iter<crnlib::__0>>
               (undefined8 *__last)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  long lVar4;
  
  uVar1 = *(undefined4 *)__last;
  uVar2 = *(undefined4 *)((long)__last + 4);
  lVar3 = __last[1];
  lVar4 = __last[-1];
  while (lVar3 < lVar4) {
    *__last = __last[-2];
    __last[1] = lVar4;
    lVar4 = __last[-3];
    __last = __last + -2;
  }
  *(undefined4 *)__last = uVar1;
  *(undefined4 *)((long)__last + 4) = uVar2;
  __last[1] = lVar3;
  return;
}

Assistant:

inline color_quad(const color_quad& other)
      : r(other.r), g(other.g), b(other.b), a(other.a) {
  }